

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

void speak_async(OpenJTalk *oj)

{
  SpeakData *pSVar1;
  int iVar2;
  long lVar3;
  PaStream *stream;
  PaStreamParameters outputParameters;
  undefined8 local_38;
  int local_30 [4];
  undefined8 local_20;
  undefined8 local_18;
  
  if (g_verbose) {
    speak_async_cold_1();
  }
  pSVar1 = g_psd;
  g_psd->finished = false;
  pSVar1->stop = false;
  pSVar1->pause = false;
  pSVar1->speaking = false;
  pSVar1->paused = false;
  local_30[0] = Pa_GetDefaultOutputDevice();
  if (local_30[0] != -1) {
    local_30[1] = 1;
    local_30[2] = 8;
    local_30[3] = 0;
    lVar3 = Pa_GetDeviceInfo(local_30[0]);
    local_20 = *(undefined8 *)(lVar3 + 0x28);
    local_18 = 0;
    iVar2 = Pa_OpenStream(((double)CONCAT44(0x45300000,(int)(g_psd->sampling_frequency >> 0x20)) -
                          1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)g_psd->sampling_frequency) -
                          4503599627370496.0),&local_38,0,local_30,0x400,1,speak_pa_callback,g_psd);
    if ((iVar2 == 0) &&
       (iVar2 = Pa_SetStreamFinishedCallback(local_38,speak_pa_finished), iVar2 == 0)) {
      g_psd->speaking = true;
      iVar2 = Pa_StartStream(local_38);
      if (iVar2 == 0) {
        sleep_internal(100);
        return;
      }
    }
  }
  if (g_psd->data != (short *)0x0) {
    free(g_psd->data);
    g_psd->data = (short *)0x0;
  }
  pSVar1 = g_psd;
  g_psd->finished = true;
  pSVar1->stop = false;
  pSVar1->pause = false;
  pSVar1->speaking = false;
  pSVar1->paused = false;
  return;
}

Assistant:

void speak_async(OpenJTalk *oj)
{
	if (g_verbose)
	{
		if (g_psd->counter == 0)
		{
			console_message(u8"非同期発声開始！\n");
		}
		else
		{
			console_message(u8"非同期発声再開\n");
		}
	}

	g_psd->finished = false;
	g_psd->speaking = false;
	g_psd->pause = false;
	g_psd->paused = false;
	g_psd->stop = false;

	PaStreamParameters outputParameters;
	PaStream *stream;
	PaError err;

	outputParameters.device = Pa_GetDefaultOutputDevice();
	if (outputParameters.device == paNoDevice)
	{
		goto exit_func;
	}
	outputParameters.channelCount = 1;
	outputParameters.sampleFormat = paInt16;
	outputParameters.suggestedLatency = Pa_GetDeviceInfo(outputParameters.device)->defaultLowOutputLatency;
	outputParameters.hostApiSpecificStreamInfo = NULL;

	err = Pa_OpenStream(
		&stream,
		NULL,
		&outputParameters,
		(double)g_psd->sampling_frequency,
		OPENJTALK_BLOCKSIZE,
		paClipOff,
		speak_pa_callback,
		g_psd);
	if (err != paNoError)
	{
		goto exit_func;
	}

	err = Pa_SetStreamFinishedCallback(stream, &speak_pa_finished);
	if (err != paNoError)
	{
		goto exit_func;
	}

	g_psd->speaking = true;
	err = Pa_StartStream(stream);
	if (err != paNoError)
	{
		goto exit_func;
	}

	sleep_internal(100);
	return;

exit_func:
	if (g_psd->data)
	{
		free(g_psd->data);
		g_psd->data = NULL;
	}
	g_psd->finished = true;
	g_psd->speaking = false;
	g_psd->pause = false;
	g_psd->paused = false;
	g_psd->stop = false;

	return;
}